

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O3

void web_server_callback(http_parser_t *parser,http_message_t *req,SOCKINFO *info)

{
  char cVar1;
  undefined8 *puVar2;
  bool bVar3;
  LinkedList *pLVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  UpnpFileInfo *p;
  char *in;
  size_t sVar8;
  UpnpListHead *pUVar9;
  char *extraout_RAX;
  off_t oVar10;
  char *pcVar11;
  ListNode *pLVar12;
  ushort **ppuVar13;
  UpnpExtraHeaders *p_00;
  UpnpListHead *elt;
  UpnpListIter pos;
  http_header_t *phVar14;
  char *pcVar15;
  SendInstruction *pSVar16;
  long lVar17;
  char *fmt;
  xml_alias_t *pxVar18;
  xml_alias_t *pxVar19;
  long lVar20;
  undefined8 uVar21;
  virtual_Dir_List *pvVar22;
  char *RetPtr;
  ulong uVar23;
  LinkedList *list;
  byte bVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  int local_72c;
  byte local_720;
  int timeout;
  ulong local_718;
  int resp_minor;
  int resp_major;
  LinkedList *local_700;
  undefined4 local_6f4;
  http_parser_t *local_6f0;
  long local_6e8;
  time_t aux_LastModified;
  long local_6d8;
  long local_6d0;
  int64_t F;
  membuffer filename;
  membuffer headers;
  long local_668;
  size_t dummy;
  SendInstruction RespInstr;
  xml_alias_t xmldoc;
  char Buf [1024];
  
  bVar24 = 0;
  memset(&RespInstr,0,0x1d0);
  membuffer_init(&headers);
  membuffer_init(&filename);
  print_http_headers(req);
  if ((2 < req->method - HTTPMETHOD_GET) && (req->method != HTTPMETHOD_SIMPLEGET)) {
    __assert_fail("req->method == HTTPMETHOD_GET || req->method == HTTPMETHOD_HEAD || req->method == HTTPMETHOD_POST || req->method == HTTPMETHOD_SIMPLEGET"
                  ,".upnp/src/genlib/net/http/webserver.c",0x4ba,
                  "int process_request(SOCKINFO *, http_message_t *, enum resp_type *, membuffer *, membuffer *, struct xml_alias_t *, struct SendInstruction *)"
                 );
  }
  p = UpnpFileInfo_new();
  http_CalcResponseVersion(req->major_version,req->minor_version,&resp_major,&resp_minor);
  sVar8 = (req->uri).pathquery.size;
  in = (char *)malloc(sVar8 + 1);
  local_6f0 = parser;
  if (in == (char *)0x0) {
LAB_00111051:
    local_72c = 500;
LAB_00111057:
    uVar23 = 0;
    bVar3 = false;
    goto LAB_0011105a;
  }
  memcpy(in,(req->uri).pathquery.buff,sVar8);
  in[sVar8] = '\0';
  dummy = sVar8;
  remove_escaped_chars(in,&dummy);
  iVar6 = remove_dots(in,(req->uri).pathquery.size);
  if (iVar6 != 0) {
    uVar23 = 0;
    bVar3 = false;
    local_72c = 0x193;
    goto LAB_0011105a;
  }
  pvVar22 = pVirtualDirList;
  if (*in != '/') {
    local_72c = 400;
    goto LAB_00111057;
  }
  for (; pvVar22 != (virtualDirList *)0x0; pvVar22 = pvVar22->next) {
    pcVar11 = pvVar22->dirName;
    sVar8 = strlen(pcVar11);
    if (sVar8 != 0) {
      cVar1 = pcVar11[sVar8 - 1];
      iVar6 = strncmp(pcVar11,in,sVar8);
      if (cVar1 == '/') {
        if (iVar6 == 0) {
LAB_0011101f:
          RespInstr.Cookie = pvVar22->cookie;
          RespInstr.IsVirtualFile = 1;
          iVar6 = membuffer_assign_str(&filename,in);
          if (iVar6 != 0) goto LAB_00111051;
          local_6f4 = 1;
          if (req->method == HTTPMETHOD_POST) {
            local_720 = 0;
            bVar3 = false;
            goto LAB_0011154c;
          }
          pUVar9 = UpnpFileInfo_get_ExtraHeadersList(p);
          list = &req->headers;
          pLVar12 = ListHead(list);
          pLVar4 = list;
          if (pLVar12 == (ListNode *)0x0) goto LAB_00111b38;
          goto LAB_00111a98;
        }
      }
      else if (((iVar6 == 0) && ((ulong)(byte)in[sVar8] < 0x40)) &&
              ((0x8000800000000001U >> ((ulong)(byte)in[sVar8] & 0x3f) & 1) != 0))
      goto LAB_0011101f;
    }
  }
  bVar3 = false;
  if (gAliasDoc.doc.buf != (char *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&gWebMutex);
    if (gAliasDoc.doc.buf == (char *)0x0) {
      __assert_fail("is_valid_alias(&gAliasDoc)",".upnp/src/genlib/net/http/webserver.c",0x18a,
                    "void alias_grab(struct xml_alias_t *)");
    }
    pxVar18 = &gAliasDoc;
    pxVar19 = &xmldoc;
    for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pxVar19->name).buf = (pxVar18->name).buf;
      pxVar18 = (xml_alias_t *)((long)pxVar18 + ((ulong)bVar24 * -2 + 1) * 8);
      pxVar19 = (xml_alias_t *)((long)pxVar19 + (ulong)bVar24 * -0x10 + 8);
    }
    *xmldoc.ct = *xmldoc.ct + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
    iVar6 = strcmp(xmldoc.name.buf,in);
    bVar3 = true;
    if (iVar6 != 0) goto LAB_00110fd7;
    UpnpFileInfo_set_FileLength(p,xmldoc.doc.length);
    UpnpFileInfo_set_IsDirectory(p,0);
    UpnpFileInfo_set_IsReadable(p,1);
    UpnpFileInfo_set_LastModified(p,xmldoc.last_modified);
    UpnpFileInfo_set_ContentType(p,"text/xml; charset=\"utf-8\"");
    pcVar11 = UpnpFileInfo_get_ContentType(p);
    if (pcVar11 == (char *)0x0) {
      uVar23 = 0;
      local_72c = 500;
      bVar3 = true;
      goto LAB_0011105a;
    }
    local_720 = 1;
    local_6f4 = 0;
    bVar3 = true;
LAB_0011154c:
    RespInstr.CorsHeader = (void *)gWebserverCorsString.length;
    if (gWebserverCorsString.length != 0) {
      RespInstr.CorsHeader = gWebserverCorsString.buf;
    }
    RespInstr.ReadSendSize = UpnpFileInfo_get_FileLength(p);
    oVar10 = UpnpFileInfo_get_FileLength(p);
    pcVar11 = (char *)malloc(0xb4);
    if (pcVar11 == (char *)0x0) {
LAB_00112081:
      uVar23 = 0;
      local_72c = 500;
    }
    else {
      local_700 = &req->headers;
      pLVar12 = ListHead(local_700);
      if (pLVar12 != (ListNode *)0x0) {
        local_6d0 = oVar10 + -1;
        local_718 = 0xb4;
        do {
          puVar2 = (undefined8 *)pLVar12->item;
          uVar7 = map_str_to_int((char *)*puVar2,puVar2[1],Http_Header_Names,0x21,0);
          uVar23 = puVar2[4];
          if (local_718 <= uVar23) {
            free(pcVar11);
            uVar23 = puVar2[4];
            local_718 = uVar23 + 1;
            pcVar11 = (char *)malloc(local_718);
            if (pcVar11 == (char *)0x0) goto LAB_00112081;
          }
          memcpy(pcVar11,(void *)puVar2[3],uVar23);
          pcVar11[puVar2[4]] = '\0';
          if (-1 < (int)uVar7) {
            iVar6 = Http_Header_Names[uVar7].id;
            if (iVar6 < 0x23) {
              if (iVar6 == 3) {
                iVar6 = atoi(pcVar11);
                RespInstr.RecvWriteSize = (long)iVar6;
              }
              else if (iVar6 == 0x1c) {
                if (puVar2[4] + 1 < 0xc9) {
                  memcpy(RespInstr.AcceptLanguageHeader,pcVar11,puVar2[4] + 1);
                }
                else {
                  memcpy(RespInstr.AcceptLanguageHeader,pcVar11,199);
                  RespInstr.AcceptLanguageHeader[199] = '\0';
                }
              }
            }
            else {
              if (iVar6 == 0x23) {
                RespInstr.IsRangeActive = 1;
                RespInstr.ReadSendSize = oVar10;
                pcVar15 = strdup(pcVar11);
                if (pcVar15 == (char *)0x0) {
                  local_72c = 500;
                }
                else {
                  pcVar26 = StrStr(pcVar15,"bytes");
                  if ((pcVar26 == (char *)0x0) ||
                     (pcVar26 = StrStr(pcVar15,"="), pcVar26 == (char *)0x0)) {
                    free(pcVar15);
                    RespInstr.IsRangeActive = 0;
                    local_72c = 400;
                  }
                  else {
                    pcVar27 = pcVar26 + 1;
                    if (oVar10 < 0) {
                      if (((*pcVar27 != '0') || (pcVar26[2] != '-')) || (pcVar26[3] != '\0'))
                      goto LAB_001120f7;
                      RespInstr.IsRangeActive = 0;
LAB_001119ce:
                      free(pcVar15);
                      goto LAB_001119d3;
                    }
                    F = -1;
                    local_668 = -1;
                    pcVar26 = strchr(pcVar27,0x2c);
                    if (pcVar26 != (char *)0x0) {
                      *pcVar26 = '\0';
                    }
                    pcVar26 = strchr(pcVar27,0x2d);
                    if (pcVar26 != (char *)0x0) {
                      local_72c = 500;
                      *pcVar26 = ' ';
                      __isoc99_sscanf(pcVar27,"%ld%ld",&F,&local_668);
                      local_6e8 = local_668;
                      lVar17 = F;
                      lVar20 = local_668;
                      if (local_668 == -1 || F == -1) {
                        local_6d8 = F;
                        *pcVar26 = '-';
                        sVar8 = strlen(pcVar27);
                        lVar17 = local_6e8;
                        lVar20 = local_6d8;
                        if (0 < (int)(uint)sVar8) {
                          uVar23 = 0;
                          do {
                            cVar1 = pcVar27[uVar23];
                            lVar17 = local_6e8;
                            lVar20 = local_6d8;
                            if (((long)cVar1 == 0x2d) ||
                               (ppuVar13 = __ctype_b_loc(), lVar17 = local_6d8, lVar20 = local_6e8,
                               (*(byte *)((long)*ppuVar13 + (long)cVar1 * 2 + 1) & 8) != 0)) break;
                            uVar23 = uVar23 + 1;
                            lVar17 = local_6e8;
                            lVar20 = local_6d8;
                          } while (((uint)sVar8 & 0x7fffffff) != uVar23);
                        }
                      }
                      if (lVar17 <= oVar10) {
                        if (((lVar17 < 0) || (lVar20 < 0)) || (lVar20 < lVar17)) {
                          if (((oVar10 - lVar17 != 0 && lVar17 <= oVar10) && (-1 < lVar17)) &&
                             (lVar5 = oVar10 - lVar17, lVar20 == -1)) goto LAB_001119b9;
                          if ((lVar17 != -1) || (lVar20 < 1)) goto LAB_001120f7;
                          lVar17 = oVar10 - lVar20;
                          lVar5 = lVar20;
                          if (oVar10 - lVar20 != 0 && lVar20 <= oVar10) goto LAB_001119b9;
                          RespInstr.RangeOffset = 0;
                          RespInstr.ReadSendSize = oVar10;
                          uVar7 = snprintf(RespInstr.RangeHeader,200,
                                           "CONTENT-RANGE: bytes 0-%ld/%ld\r\n",local_6d0);
                        }
                        else {
                          if (oVar10 <= lVar20) {
                            lVar20 = local_6d0;
                          }
                          lVar5 = (lVar20 - lVar17) + 1;
LAB_001119b9:
                          RespInstr.ReadSendSize = lVar5;
                          RespInstr.RangeOffset = lVar17;
                          uVar7 = snprintf(RespInstr.RangeHeader,200,
                                           "CONTENT-RANGE: bytes %ld-%ld/%ld\r\n");
                        }
                        if (199 < uVar7) {
                          free(pcVar15);
                          goto LAB_00112104;
                        }
                        goto LAB_001119ce;
                      }
                    }
LAB_001120f7:
                    free(pcVar15);
                    local_72c = 0x1a0;
                  }
                }
LAB_00112104:
                free(pcVar11);
                uVar23 = 0;
                goto LAB_0011105a;
              }
              if (iVar6 == 0x24) {
                RespInstr.IsChunkActive = 1;
                sVar8 = strlen(pcVar11);
                if ((4 < sVar8) && (pcVar15 = StrStr(pcVar11,"trailers"), pcVar15 != (char *)0x0)) {
                  RespInstr.IsTrailers = 1;
                }
              }
            }
          }
LAB_001119d3:
          pLVar12 = ListNext(local_700,pLVar12);
        } while (pLVar12 != (ListNode *)0x0);
      }
      free(pcVar11);
      if (req->method == HTTPMETHOD_POST) {
        uVar23 = 4;
      }
      else {
        if ((local_720 == 0) && (oVar10 = UpnpFileInfo_get_FileLength(p), oVar10 == -3)) {
          if ((resp_major != 1) || (resp_minor != 1)) {
            uVar23 = 0;
            local_72c = 0x196;
            goto LAB_0011105a;
          }
          RespInstr.IsChunkActive = 1;
        }
        aux_LastModified = UpnpFileInfo_get_LastModified(p);
        pcVar11 = (char *)RespInstr.ReadSendSize;
        if (RespInstr.IsRangeActive == 0) {
          if (RespInstr.IsChunkActive == 0) {
            pSVar16 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
            pcVar15 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
            if (-1 < (long)pcVar11) {
              pcVar26 = (char *)&aux_LastModified;
              fmt = "RNTLADstcSXcECc";
              uVar21 = 200;
              pcVar27 = "redsonic";
              pcVar25 = "LAST-MODIFIED: ";
              goto LAB_00112074;
            }
            pcVar11 = "RTLADstcSXcECc";
          }
          else {
            pSVar16 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
            pcVar15 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
            pcVar11 = "RKTLADstcSXcECc";
          }
          iVar6 = http_MakeMessage(&headers,resp_major,resp_minor,pcVar11,200,pSVar16,&RespInstr,
                                   &RespInstr,"LAST-MODIFIED: ",&aux_LastModified,"redsonic",pcVar15
                                  );
        }
        else {
          if (RespInstr.IsChunkActive == 0) {
            pSVar16 = (SendInstruction *)UpnpFileInfo_get_ContentType(p);
            UpnpFileInfo_get_ExtraHeadersList(p);
            pcVar27 = (char *)&aux_LastModified;
            fmt = "RNTGLADstcSXcECc";
            uVar21 = 0xce;
            pcVar15 = "redsonic";
            pcVar26 = "LAST-MODIFIED: ";
            pcVar25 = (char *)&RespInstr;
          }
          else {
            pcVar11 = UpnpFileInfo_get_ContentType(p);
            pcVar15 = (char *)UpnpFileInfo_get_ExtraHeadersList(p);
            pcVar26 = (char *)&aux_LastModified;
            fmt = "RTGKLADstcSXcECc";
            uVar21 = 0xce;
            pcVar27 = "redsonic";
            pcVar25 = "LAST-MODIFIED: ";
            pSVar16 = &RespInstr;
          }
LAB_00112074:
          iVar6 = http_MakeMessage(&headers,resp_major,resp_minor,fmt,uVar21,pcVar11,pSVar16,
                                   &RespInstr,&RespInstr,pcVar25,pcVar26,pcVar27,pcVar15);
        }
        if (iVar6 != 0) goto LAB_00112081;
        uVar7 = 1;
        if ((char)local_6f4 != '\0') {
          uVar7 = (uint)(local_720 ^ 1) + (uint)(local_720 ^ 1) * 2;
        }
        uVar23 = 2;
        if (req->method != HTTPMETHOD_HEAD) {
          uVar23 = (ulong)uVar7;
        }
        if (req->method == HTTPMETHOD_SIMPLEGET) {
          membuffer_destroy(&headers);
        }
      }
      local_72c = 200;
    }
    goto LAB_0011105a;
  }
LAB_00110fd7:
  if ((gDocumentRootDir.length == 0) ||
     (iVar6 = membuffer_assign_str(&filename,gDocumentRootDir.buf), iVar6 != 0)) {
LAB_00111011:
    local_72c = 500;
  }
  else {
    uVar7 = membuffer_append_str(&filename,in);
    if (uVar7 != 0) goto LAB_00111011;
    pcVar11 = (char *)(ulong)uVar7;
    if (filename.length != 0) {
      do {
        pcVar11 = filename.buf;
        if (filename.buf[filename.length - 1] != '/') break;
        membuffer_delete(&filename,filename.length - 1,1);
        pcVar11 = extraout_RAX;
      } while (filename.length != 0);
    }
    local_6f4 = (undefined4)CONCAT71((int7)((ulong)pcVar11 >> 8),1);
    if (req->method == HTTPMETHOD_POST) {
      local_720 = 1;
      goto LAB_0011154c;
    }
    iVar6 = get_file_info(filename.buf,p);
    if (iVar6 == 0) {
      iVar6 = UpnpFileInfo_get_IsDirectory(p);
      if (iVar6 != 0) {
        pcVar11 = "/index.html";
        if (filename.buf[filename.length - 1] == '/') {
          pcVar11 = "index.html";
        }
        iVar6 = membuffer_append_str(&filename,pcVar11);
        if (iVar6 != 0) goto LAB_00111011;
        iVar6 = get_file_info(filename.buf,p);
        if ((iVar6 != 0) || (iVar6 = UpnpFileInfo_get_IsDirectory(p), iVar6 != 0))
        goto LAB_00111d69;
      }
      iVar6 = UpnpFileInfo_get_IsReadable(p);
      local_720 = 1;
      goto joined_r0x00111e1a;
    }
LAB_00111d69:
    local_72c = 0x194;
  }
  uVar23 = 0;
LAB_0011105a:
  free(in);
  pUVar9 = UpnpFileInfo_get_ExtraHeadersList(p);
  FreeExtraHTTPHeaders(pUVar9);
  UpnpFileInfo_delete(p);
  if (bVar3 && local_72c != 200) {
    alias_release(&xmldoc);
  }
  else if (local_72c == 200) {
    (*(code *)((long)&DAT_0012cde8 + (long)(int)(&DAT_0012cde8)[uVar23]))();
    return;
  }
  http_SendStatusResponse(info,local_72c,req->major_version,req->minor_version);
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/webserver.c",0x71e,
             "webserver: request processed...\n");
  membuffer_destroy(&headers);
  membuffer_destroy(&filename);
  return;
LAB_00111a98:
  do {
    local_700 = pLVar4;
    puVar2 = (undefined8 *)pLVar12->item;
    iVar6 = map_str_to_int((char *)*puVar2,puVar2[1],Http_Header_Names,0x21,0);
    if (iVar6 < 0) {
      p_00 = UpnpExtraHeaders_new();
      if (p_00 == (UpnpExtraHeaders *)0x0) {
        FreeExtraHTTPHeaders(pUVar9);
        goto LAB_00111051;
      }
      elt = UpnpExtraHeaders_get_node(p_00);
      pos = UpnpListEnd(pUVar9);
      list = local_700;
      UpnpListInsert(pUVar9,pos,elt);
      UpnpExtraHeaders_strncpy_name(p_00,(char *)*puVar2,puVar2[1]);
      UpnpExtraHeaders_strncpy_value(p_00,(char *)puVar2[3],puVar2[4]);
    }
    pLVar12 = ListNext(list,pLVar12);
    pLVar4 = local_700;
  } while (pLVar12 != (ListNode *)0x0);
LAB_00111b38:
  UpnpFileInfo_set_CtrlPtIPAddr(p,&info->foreign_sockaddr);
  phVar14 = httpmsg_find_hdr(req,0x18,(memptr *)Buf);
  if (phVar14 != (http_header_t *)0x0) {
    UpnpFileInfo_strncpy_Os(p,(char *)Buf._0_8_,Buf._8_8_);
  }
  iVar6 = (*virtualDirCallback.get_info)(filename.buf,p,RespInstr.Cookie,&RespInstr.RequestCookie);
  uVar23 = 0;
  if (iVar6 != 0) {
LAB_00111baa:
    bVar3 = false;
    local_72c = 0x194;
    goto LAB_0011105a;
  }
  iVar6 = UpnpFileInfo_get_IsDirectory(p);
  if (iVar6 != 0) {
    pcVar11 = "/index.html";
    if (filename.buf[filename.length - 1] == '/') {
      pcVar11 = "index.html";
    }
    iVar6 = membuffer_append_str(&filename,pcVar11);
    if (iVar6 != 0) goto LAB_00111051;
    iVar6 = (*virtualDirCallback.get_info)(filename.buf,p,RespInstr.Cookie,&RespInstr.RequestCookie)
    ;
    if (iVar6 != 0) goto LAB_00111baa;
    iVar6 = UpnpFileInfo_get_IsDirectory(p);
    bVar3 = false;
    local_72c = 0x194;
    if (iVar6 != 0) goto LAB_0011105a;
  }
  iVar6 = UpnpFileInfo_get_IsReadable(p);
  bVar3 = false;
  local_720 = 0;
joined_r0x00111e1a:
  local_72c = 0x193;
  uVar23 = 0;
  if (iVar6 == 0) goto LAB_0011105a;
  goto LAB_0011154c;
}

Assistant:

void web_server_callback(
	http_parser_t *parser, /* INOUT */ http_message_t *req, SOCKINFO *info)
{
	int ret;
	int timeout = -1;
	enum resp_type rtype = 0;
	membuffer headers;
	membuffer filename;
	struct xml_alias_t xmldoc;
	struct SendInstruction RespInstr;

	/* init */
	memset(&RespInstr, 0, sizeof(RespInstr));
	membuffer_init(&headers);
	membuffer_init(&filename);

	/* Process request should create the different kind of header depending
	 * on the type of request. */
	ret = process_request(
		info, req, &rtype, &headers, &filename, &xmldoc, &RespInstr);
	if (ret != HTTP_OK) {
		/* send error code */
		http_SendStatusResponse(
			info, ret, req->major_version, req->minor_version);
	} else {
		/* send response */
		switch (rtype) {
		case RESP_FILEDOC:
			http_SendMessage(info,
				&timeout,
				"Ibf",
				&RespInstr,
				headers.buf,
				headers.length,
				filename.buf);
			break;
		case RESP_XMLDOC:
			http_SendMessage(info,
				&timeout,
				"Ibb",
				&RespInstr,
				headers.buf,
				headers.length,
				xmldoc.doc.buf,
				xmldoc.doc.length);
			alias_release(&xmldoc);
			break;
		case RESP_WEBDOC:
			/*http_SendVirtualDirDoc(info, &timeout, "Ibf",
				&RespInstr,
				headers.buf, headers.length,
				filename.buf);*/
			http_SendMessage(info,
				&timeout,
				"Ibf",
				&RespInstr,
				headers.buf,
				headers.length,
				filename.buf);
			break;
		case RESP_HEADERS:
			/* headers only */
			http_SendMessage(info,
				&timeout,
				"b",
				headers.buf,
				headers.length);
			break;
		case RESP_POST:
			/* headers only */
			ret = http_RecvPostMessage(
				parser, info, filename.buf, &RespInstr);
			/* Send response. */
			http_MakeMessage(&headers,
				1,
				1,
				"RTLSXcCc",
				ret,
				"text/html",
				&RespInstr,
				X_USER_AGENT);
			http_SendMessage(info,
				&timeout,
				"b",
				headers.buf,
				headers.length);
			break;
		default:
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"webserver: Invalid response type received.\n");
			assert(0);
		}
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"webserver: request processed...\n");
	membuffer_destroy(&headers);
	membuffer_destroy(&filename);
}